

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

QModelIndexList * __thiscall
QItemSelection::indexes(QModelIndexList *__return_storage_ptr__,QItemSelection *this)

{
  const_iterator __begin1;
  QItemSelectionRange *range;
  long lVar1;
  
  range = (this->super_QList<QItemSelectionRange>).d.ptr;
  lVar1 = (this->super_QList<QItemSelectionRange>).d.size;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (lVar1 != 0) {
    lVar1 = lVar1 << 4;
    do {
      indexesFromRange<QList<QModelIndex>>(range,__return_storage_ptr__);
      range = range + 1;
      lVar1 = lVar1 + -0x10;
    } while (lVar1 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndexList QItemSelection::indexes() const
{
    return qSelectionIndexes<QModelIndexList>(*this);
}